

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::StartCall<true>
          (SQVM *this,SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,
          bool tailcall)

{
  SQFunctionProto *pSVar1;
  long lVar2;
  SQObjectPtr *pSVar3;
  CallInfo *pCVar4;
  bool bVar5;
  long lVar6;
  SQArray *x;
  SQGenerator *this_00;
  char *pcVar7;
  char *pcVar8;
  char *s;
  SQFunctionProto *f;
  ulong uVar9;
  undefined4 uVar10;
  long lVar11;
  long lVar12;
  SQInteger n;
  long lVar13;
  ulong uVar14;
  SQObjectPtr temp;
  
  pSVar1 = closure->_function;
  lVar11 = pSVar1->_nparameters;
  lVar2 = pSVar1->_stacksize;
  if (pSVar1->_varparams == 0) {
    if (lVar11 != args) {
      lVar12 = pSVar1->_ndefaultparams;
      lVar6 = lVar11 - args;
      if (((lVar6 == 0 || lVar11 < args) || lVar12 == 0) ||
         (lVar13 = lVar12 - lVar6, lVar12 < lVar6)) {
        pcVar7 = "unknown";
        pcVar8 = "unknown";
        if ((pSVar1->_name).super_SQObject._type == OT_STRING) {
          pcVar8 = (char *)&((pSVar1->_name).super_SQObject._unVal.pTable)->_firstfree;
        }
        if ((pSVar1->_sourcename).super_SQObject._type == OT_STRING) {
          pcVar7 = (char *)&((pSVar1->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
        }
        if (pSVar1->_nlineinfos < 1) {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)(*(uint *)&pSVar1->_lineinfos->field_0x4 & 0x7fffffff);
        }
        uVar10 = (undefined4)lVar11;
        s = "wrong number of parameters passed to \'%s\' %s:%d (%d passed, %d required)";
        goto LAB_0013a35a;
      }
      lVar6 = lVar13 * 0x10;
      lVar11 = args * 0x10 + stackbase * 0x10;
      for (; lVar13 < lVar12; lVar13 = lVar13 + 1) {
        SQObjectPtr::operator=
                  ((SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar11),
                   (SQObjectPtr *)((long)&(closure->_defaultparams->super_SQObject)._type + lVar6));
        lVar6 = lVar6 + 0x10;
        lVar11 = lVar11 + 0x10;
      }
    }
  }
  else {
    lVar11 = lVar11 + -1;
    uVar9 = args - lVar11;
    if (args < lVar11) {
      pcVar7 = "unknown";
      pcVar8 = "unknown";
      if ((pSVar1->_name).super_SQObject._type == OT_STRING) {
        pcVar8 = (char *)&((pSVar1->_name).super_SQObject._unVal.pTable)->_firstfree;
      }
      if ((pSVar1->_sourcename).super_SQObject._type == OT_STRING) {
        pcVar7 = (char *)&((pSVar1->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
      }
      if (pSVar1->_nlineinfos < 1) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)(*(uint *)&pSVar1->_lineinfos->field_0x4 & 0x7fffffff);
      }
      uVar10 = (undefined4)lVar11;
      s = "wrong number of parameters passed to \'%s\' %s:%d (%d passed, at least %d required)";
LAB_0013a35a:
      Raise_Error(this,s,pcVar8,pcVar7,uVar9,args & 0xffffffff,uVar10);
      return false;
    }
    x = SQArray::Create(this->_sharedstate,uVar9);
    uVar14 = 0;
    if ((long)uVar9 < 1) {
      uVar9 = uVar14;
    }
    lVar12 = (lVar11 + stackbase) * 0x10;
    for (; pSVar3 = (this->_stack)._vals, uVar9 != uVar14; uVar14 = uVar14 + 1) {
      SQObjectPtr::operator=
                ((x->_values)._vals + (uVar14 & 0xffffffff),
                 (SQObjectPtr *)((long)&(pSVar3->super_SQObject)._type + lVar12));
      SQObjectPtr::Null((SQObjectPtr *)
                        ((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar12));
      lVar12 = lVar12 + 0x10;
    }
    SQObjectPtr::operator=(pSVar3 + lVar11 + stackbase,x);
  }
  if (closure->_env != (SQWeakRef *)0x0) {
    SQObjectPtr::operator=((this->_stack)._vals + stackbase,&closure->_env->_obj);
  }
  bVar5 = EnterFrame(this,stackbase,lVar2 + stackbase,tailcall);
  if (bVar5) {
    SQObjectPtr::operator=(&this->ci->_closure,closure);
    pCVar4 = this->ci;
    pCVar4->_literals = pSVar1->_literals;
    pCVar4->_ip = pSVar1->_instructions;
    pCVar4->_target = (SQInt32)target;
    if (this->_debughook == true) {
      CallDebugHook(this,99,0);
    }
    pSVar1 = closure->_function;
    if (pSVar1->_bgenerator != true) {
      return true;
    }
    this_00 = SQGenerator::Create(this->_sharedstate,closure);
    bVar5 = SQGenerator::Yield(this_00,this,pSVar1->_stacksize);
    if (bVar5) {
      temp.super_SQObject._unVal.pTable = (SQTable *)0x0;
      temp.super_SQObject._type = OT_NULL;
      temp.super_SQObject._flags = '\0';
      temp.super_SQObject._5_3_ = 0;
      Return<true>(this,1,target,&temp);
      SQObjectPtr::operator=((this->_stack)._vals + this->_stackbase + target,this_00);
      SQObjectPtr::~SQObjectPtr(&temp);
      return true;
    }
  }
  return false;
}

Assistant:

bool SQVM::StartCall(SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,bool tailcall)
{
    SQFunctionProto *func = closure->_function;

    SQInteger paramssize = func->_nparameters;
    const SQInteger newtop = stackbase + func->_stacksize;
    SQInteger nargs = args;
    if(func->_varparams)
    {
        paramssize--;
        if (nargs < paramssize) {
            Raise_Error(_SC("wrong number of parameters passed to '%s' %s:%d (%d passed, at least %d required)"),
              sq_type(func->_name) == OT_STRING ? _stringval(func->_name) : _SC("unknown"),
              sq_type(func->_sourcename) == OT_STRING ? _stringval(func->_sourcename) : _SC("unknown"),
              int(func->_nlineinfos > 0 ? func->_lineinfos[0]._line : 0),
              (int)nargs, (int)paramssize);
            return false;
        }

        //dumpstack(stackbase);
        SQInteger nvargs = nargs - paramssize;
        SQArray *arr = SQArray::Create(_ss(this),nvargs);
        SQInteger pbase = stackbase+paramssize;
        for(SQInteger n = 0; n < nvargs; n++) {
            arr->_values[n] = _stack._vals[pbase];
            _stack._vals[pbase].Null();
            pbase++;

        }
        _stack._vals[stackbase+paramssize] = arr;
        //dumpstack(stackbase);
    }
    else if (paramssize != nargs) {
        SQInteger ndef = func->_ndefaultparams;
        SQInteger diff;
        if(ndef && nargs < paramssize && (diff = paramssize - nargs) <= ndef) {
            for(SQInteger n = ndef - diff; n < ndef; n++) {
                _stack._vals[stackbase + (nargs++)] = closure->_defaultparams[n];
            }
        }
        else {
            Raise_Error(_SC("wrong number of parameters passed to '%s' %s:%d (%d passed, %d required)"),
              sq_type(func->_name) == OT_STRING ? _stringval(func->_name) : _SC("unknown"),
              sq_type(func->_sourcename) == OT_STRING ? _stringval(func->_sourcename) : _SC("unknown"),
              int(func->_nlineinfos > 0 ? func->_lineinfos[0]._line : 0),
              (int)nargs, (int)paramssize);
            return false;
        }
    }

    if(closure->_env) {
        _stack._vals[stackbase] = closure->_env->_obj;
    }

    if(!EnterFrame(stackbase, newtop, tailcall)) return false;

    ci->_closure  = closure;
    ci->_literals = func->_literals;
    ci->_ip       = func->_instructions;
    ci->_target   = (SQInt32)target;
    if constexpr (debughookPresent)
    {
        if (_debughook) {
            CallDebugHook(_SC('c'));
        }
    }

    if (closure->_function->_bgenerator) {
        SQFunctionProto *f = closure->_function;
        SQGenerator *gen = SQGenerator::Create(_ss(this), closure);
        if(!gen->Yield(this,f->_stacksize))
            return false;
        SQObjectPtr temp;
        Return<debughookPresent>(1, target, temp);
        STK(target) = gen;
    }


    return true;
}